

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_cdef(lua_State *L)

{
  int errcode_00;
  long in_RDI;
  int errcode;
  CPState cp;
  GCstr *s;
  CTState *cts;
  CPState *in_stack_00000140;
  lua_State *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  lua_State *in_stack_ffffffffffffff80;
  
  lj_lib_checkstr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  *(long *)((ulong)*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x194) + 0x10) = in_RDI;
  errcode_00 = lj_cparse(in_stack_00000140);
  if (errcode_00 != 0) {
    lj_err_throw(in_stack_ffffffffffffff70,errcode_00);
  }
  if (*(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x54) <=
      *(uint *)((ulong)*(uint *)(in_RDI + 8) + 0x50)) {
    lj_gc_step((lua_State *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  return 0;
}

Assistant:

LJLIB_CF(ffi_cdef)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  CPState cp;
  int errcode;
  cp.L = L;
  cp.cts = ctype_cts(L);
  cp.srcname = strdata(s);
  cp.p = strdata(s);
  cp.param = L->base+1;
  cp.mode = CPARSE_MODE_MULTI|CPARSE_MODE_DIRECT;
  errcode = lj_cparse(&cp);
  if (errcode) lj_err_throw(L, errcode);  /* Propagate errors. */
  lj_gc_check(L);
  return 0;
}